

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O1

void __thiscall
duckdb::GlobalUngroupedAggregateState::Combine
          (GlobalUngroupedAggregateState *this,LocalUngroupedAggregateState *other)

{
  int iVar1;
  const_reference this_00;
  pointer this_01;
  BoundAggregateExpression *pBVar2;
  reference pvVar3;
  size_type __n;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_02;
  AggregateInputData aggr_input_data;
  Vector dest_state;
  Vector source_state;
  FunctionData *local_140;
  element_type *local_138;
  undefined1 local_130;
  Vector local_100;
  Vector local_98;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this_02 = (this->state).aggregate_expressions;
    if ((this_02->
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this_02->
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](this_02,__n);
        this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_00);
        pBVar2 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                           (&this_01->super_BaseExpression);
        if (pBVar2->aggr_type != DISTINCT) {
          pvVar3 = vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_true>
                   ::operator[](&(other->state).aggregate_data,__n);
          Value::POINTER((Value *)&local_100,
                         (uintptr_t)
                         (pvVar3->
                         super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>).
                         _M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
          Vector::Vector(&local_98,(Value *)&local_100);
          Value::~Value((Value *)&local_100);
          pvVar3 = vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_true>
                   ::operator[](&(this->state).aggregate_data,__n);
          Value::POINTER((Value *)&local_140,
                         (uintptr_t)
                         (pvVar3->
                         super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>).
                         _M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
          Vector::Vector(&local_100,(Value *)&local_140);
          Value::~Value((Value *)&local_140);
          local_140 = (pBVar2->bind_info).
                      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                      .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
          local_130 = 2;
          local_138 = (element_type *)&this->allocator;
          (*(pBVar2->function).combine)(&local_98,&local_100,(AggregateInputData *)&local_140,1);
          if (local_100.auxiliary.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.auxiliary.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_100.buffer.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.buffer.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          LogicalType::~LogicalType(&local_100.type);
          if (local_98.auxiliary.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_98.auxiliary.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_98.buffer.internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_98.buffer.internal.
                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          LogicalType::~LogicalType(&local_98.type);
        }
        __n = __n + 1;
        this_02 = (this->state).aggregate_expressions;
      } while (__n < (ulong)((long)(this_02->
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_02->
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void GlobalUngroupedAggregateState::Combine(LocalUngroupedAggregateState &other) {
	lock_guard<mutex> glock(lock);
	for (idx_t aggr_idx = 0; aggr_idx < state.aggregate_expressions.size(); aggr_idx++) {
		auto &aggregate = state.aggregate_expressions[aggr_idx]->Cast<BoundAggregateExpression>();

		if (aggregate.IsDistinct()) {
			continue;
		}

		Vector source_state(Value::POINTER(CastPointerToValue(other.state.aggregate_data[aggr_idx].get())));
		Vector dest_state(Value::POINTER(CastPointerToValue(state.aggregate_data[aggr_idx].get())));

		AggregateInputData aggr_input_data(aggregate.bind_info.get(), allocator,
		                                   AggregateCombineType::ALLOW_DESTRUCTIVE);
		aggregate.function.combine(source_state, dest_state, aggr_input_data, 1);
#ifdef DEBUG
		state.counts[aggr_idx] += other.state.counts[aggr_idx];
#endif
	}
}